

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O1

Object * __thiscall LiteScript::_BasicMemory_1::CreateAt(_BasicMemory_1 *this,uint id)

{
  short sVar1;
  Memory *pMVar2;
  _BasicMemory_0 *p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = id >> 8;
  if ((this->arr)._M_elems[uVar7] == (_BasicMemory_0 *)0x0) {
    p_Var3 = (_BasicMemory_0 *)operator_new(0x2f20);
    pMVar2 = this->memory;
    p_Var3->first_free = 0;
    p_Var3->count = 0;
    p_Var3->memory = pMVar2;
    p_Var3->Count = &p_Var3->count;
    lVar5 = 0x1600;
    do {
      *(short *)(p_Var3->arr + lVar5 * 2) = (short)lVar5 + -0x15ff;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x1700);
    (this->arr)._M_elems[uVar7] = p_Var3;
    (this->nfull)._M_elems[uVar7] = this->first_nfull;
    this->first_nfull = (short)(id >> 8);
  }
  p_Var3 = (this->arr)._M_elems[uVar7];
  uVar6 = (ulong)id & 0xff;
  Object::Object((Object *)(p_Var3->arr + uVar6 * 0x28),p_Var3->memory,id);
  (p_Var3->free)._M_elems[uVar6] = p_Var3->first_free;
  p_Var3->first_free = (short)uVar6;
  (p_Var3->ref_cpt)._M_elems[uVar6] = 0;
  (p_Var3->free)._M_elems[uVar6] = -1;
  p_Var3->count = p_Var3->count + 1;
  this->count = this->count + 1;
  if ((this->arr)._M_elems[uVar7]->count == 0x100) {
    uVar4 = 0;
    do {
      if (uVar7 == (int)(this->nfull)._M_elems[uVar4]) goto LAB_0012b958;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x100);
    uVar4 = 0x100;
LAB_0012b958:
    sVar1 = (this->nfull)._M_elems[uVar7];
    if ((int)uVar4 == 0x100) {
      this->first_nfull = sVar1;
    }
    else {
      (this->nfull)._M_elems[uVar4 & 0xffffffff] = sVar1;
    }
  }
  return (Object *)(p_Var3->arr + uVar6 * 0x28);
}

Assistant:

LiteScript::Object& LiteScript::_BasicMemory_1::CreateAt(unsigned int id) {
    unsigned int block = id >> 8;
    if (this->arr[block] == nullptr) {
        this->arr[block] = new LiteScript::_BasicMemory_0(this->memory);
        this->nfull[block] = this->first_nfull;
        this->first_nfull = (short)block;
    }
    Object& obj = this->arr[block]->CreateAt(id);
    this->count++;
    if (this->arr[block]->isFull()) {
        unsigned int j;
        for (j = 0; j < LITESCRIPT_MEMORY_1_SIZE && this->nfull[j] != block; j++);
        if (j == LITESCRIPT_MEMORY_1_SIZE)
            this->first_nfull = this->nfull[block];
        else
            this->nfull[j] = this->nfull[block];
    }
    return obj;
}